

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llvm-pta-dump.cpp
# Opt level: O0

void dumpPointerGraphData(PSNode *n,PTType type,bool dot)

{
  byte bVar1;
  bool bVar2;
  MemoryObject *pMVar3;
  map<dg::pta::PSNode_*,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>,_std::less<dg::pta::PSNode_*>,_std::allocator<std::pair<dg::pta::PSNode_*const,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>_>_>_>
  *pmVar4;
  byte in_DL;
  int in_ESI;
  PSNode *in_RDI;
  MemoryMapT *unaff_retaddr;
  MemoryMapT *mm;
  MemoryObject *mo;
  bool in_stack_0000004b;
  int in_stack_0000004c;
  MemoryObject *in_stack_00000050;
  
  bVar1 = in_DL & 1;
  if (in_ESI == 0) {
    pMVar3 = dg::SubgraphNode<dg::pta::PSNode>::getData<dg::pta::MemoryObject>
                       ((SubgraphNode<dg::pta::PSNode> *)(in_RDI + 8));
    if (pMVar3 != (MemoryObject *)0x0) {
      if (bVar1 == 0) {
        printf("    Memory: ---\n");
      }
      else {
        printf("\\n    Memory: ---\\n");
      }
      dumpMemoryObject(in_stack_00000050,in_stack_0000004c,in_stack_0000004b);
      if (bVar1 == 0) {
        printf("    -----------\n");
      }
    }
  }
  else {
    pmVar4 = dg::SubgraphNode<dg::pta::PSNode>::
             getData<std::map<dg::pta::PSNode*,std::unique_ptr<dg::pta::MemoryObject,std::default_delete<dg::pta::MemoryObject>>,std::less<dg::pta::PSNode*>,std::allocator<std::pair<dg::pta::PSNode*const,std::unique_ptr<dg::pta::MemoryObject,std::default_delete<dg::pta::MemoryObject>>>>>>
                       ((SubgraphNode<dg::pta::PSNode> *)(in_RDI + 8));
    if (pmVar4 != (map<dg::pta::PSNode_*,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>,_std::less<dg::pta::PSNode_*>,_std::allocator<std::pair<dg::pta::PSNode_*const,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>_>_>_>
                   *)0x0) {
      if (bVar1 == 0) {
        printf("    Memory map: [%p]\n",pmVar4);
      }
      else {
        printf("\\n------\\n    --- Memory map [%p] ---\\n",pmVar4);
      }
      bVar2 = llvm::cl::opt_storage::operator_cast_to_bool
                        ((opt_storage<bool,_false,_false> *)0x165815);
      if ((bVar2) || (bVar2 = mmChanged(in_RDI), bVar2)) {
        dumpMemoryMap(unaff_retaddr,(int)((ulong)in_RDI >> 0x20),SUB81((ulong)in_RDI >> 0x18,0));
      }
      if (bVar1 == 0) {
        printf("    ----------------\n");
      }
    }
  }
  return;
}

Assistant:

static void dumpPointerGraphData(PSNode *n, PTType type, bool dot = false) {
    assert(n && "No node given");
    if (type == dg::LLVMPointerAnalysisOptions::AnalysisType::fi) {
        MemoryObject *mo = n->getData<MemoryObject>();
        if (!mo)
            return;

        if (dot)
            printf("\\n    Memory: ---\\n");
        else
            printf("    Memory: ---\n");

        dumpMemoryObject(mo, 6, dot);

        if (!dot)
            printf("    -----------\n");
    } else {
        PointerAnalysisFS::MemoryMapT *mm =
                n->getData<PointerAnalysisFS::MemoryMapT>();
        if (!mm)
            return;

        if (dot)
            printf(R"(\n------\n    --- Memory map [%p] ---\n)",
                   static_cast<void *>(mm));
        else
            printf("    Memory map: [%p]\n", static_cast<void *>(mm));

        if (verbose_more || mmChanged(n))
            dumpMemoryMap(mm, 6, dot);

        if (!dot)
            printf("    ----------------\n");
    }
}